

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

bool __thiscall
dlib::image_window::get_next_keypress
          (image_window *this,unsigned_long *key,bool *is_printable,unsigned_long *state)

{
  bool bVar1;
  void *__stat_loc;
  auto_mutex lock;
  auto_mutex local_40;
  
  local_40.r = (this->super_drawable_window).super_base_window.wm;
  local_40.m = (mutex *)0x0;
  local_40.rw = (read_write_mutex *)0x0;
  __stat_loc = (void *)0x1;
  rmutex::lock(local_40.r,1);
  do {
    if (this->have_last_keypress != false) {
      if ((this->window_has_closed & 1U) == 0) {
        this->have_last_keypress = false;
        *key = this->next_key;
        *is_printable = this->next_is_printable;
        *state = this->next_state;
        bVar1 = true;
      }
      else {
LAB_00276c9f:
        bVar1 = false;
      }
      auto_mutex::unlock(&local_40);
      return bVar1;
    }
    if ((this->window_has_closed & 1U) != 0) goto LAB_00276c9f;
    if ((this->have_last_click != false) && (this->tie_input_events != false)) {
      *key = 0;
      *is_printable = true;
      goto LAB_00276c9f;
    }
    rsignaler::wait(&this->clicked_signaler,__stat_loc);
  } while( true );
}

Assistant:

bool image_window::
    get_next_keypress (
        unsigned long& key,
        bool& is_printable,
        unsigned long& state
    ) 
    {
        auto_mutex lock(wm);
        while (have_last_keypress == false && !window_has_closed &&
            (have_last_click == false || !tie_input_events))
        {
            clicked_signaler.wait();
        }

        if (window_has_closed)
            return false;

        if (have_last_keypress)
        {
            // Mark that we are taking the key click so the next call to get_next_keypress()
            // will have to wait for another click.
            have_last_keypress = false;
            key = next_key;
            is_printable = next_is_printable;
            state = next_state;
            return true;
        }
        else
        {
            key = 0;
            is_printable = true;
            return false;
        }
    }